

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void pfederc::fatal(char *file,int line,string *msg)

{
  ostream *poVar1;
  string *msg_local;
  int line_local;
  char *file_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,file);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void pfederc::fatal(const char *file,
    int line, const std::string &msg) noexcept {
  std::cerr << file << ':' << line << ": " << msg << std::endl;
  std::exit(1);
}